

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::InitializeProfileAllocTracker(Recycler *this)

{
  bool bVar1;
  BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  CCLock *this_01;
  
  bVar1 = DoProfileAllocTracker();
  if (bVar1) {
    this_00 = (BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)NoCheckHeapAllocator::Alloc
                           ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x38);
    this_00->buckets = (Type)0x0;
    this_00->entries = (Type)0x0;
    this_00->alloc = (Type)&NoCheckHeapAllocator::Instance;
    this_00->size = 0;
    this_00->bucketCount = 0;
    this_00->count = 0;
    this_00->freeCount = 0;
    this_00->modFunctionIndex = 0x4b;
    this_00->stats = (Type)0x0;
    JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize(this_00,0xa3);
    this->trackerDictionary = this_00;
    this_01 = (CCLock *)operator_new(0x40);
    this_01->mutexPtr[0] = '\0';
    this_01->mutexPtr[1] = '\0';
    this_01->mutexPtr[2] = '\0';
    this_01->mutexPtr[3] = '\0';
    this_01->mutexPtr[4] = '\0';
    this_01->mutexPtr[5] = '\0';
    this_01->mutexPtr[6] = '\0';
    this_01->mutexPtr[7] = '\0';
    CCLock::Reset(this_01,true);
    this->trackerCriticalSection = (CriticalSection *)this_01;
  }
  (this->nextAllocData).typeinfo = (type_info *)0x0;
  (this->nextAllocData).plusSize = 0;
  (this->nextAllocData).count = 0;
  return;
}

Assistant:

void
Recycler::InitializeProfileAllocTracker()
{
    if (DoProfileAllocTracker())
    {
        trackerDictionary = NoCheckHeapNew(TypeInfotoTrackerItemMap, &NoCheckHeapAllocator::Instance, 163);
        trackerCriticalSection = new CriticalSection(1000);
#pragma prefast(suppress:6031, "InitializeCriticalSectionAndSpinCount always succeed since Vista. No need to check return value");
    }

    nextAllocData.Clear();
}